

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_packet_socket.c
# Opt level: O1

_Bool oonf_packet_managed_is_active(oonf_packet_managed *managed,int af_type)

{
  list_entity *plVar1;
  long lVar2;
  
  if (af_type == 10) {
    lVar2 = 0x308;
    plVar1 = (managed->socket_v6).node.next;
  }
  else {
    if (af_type != 2) {
      return false;
    }
    lVar2 = 8;
    plVar1 = (managed->socket_v4).node.next;
  }
  if (plVar1 == (list_entity *)0x0) {
    return false;
  }
  return *(long *)((long)&(managed->socket_v4).node.next + lVar2) != 0;
}

Assistant:

bool
oonf_packet_managed_is_active(struct oonf_packet_managed *managed, int af_type) {
  switch (af_type) {
    case AF_INET:
      return oonf_packet_is_active(&managed->socket_v4);
    case AF_INET6:
      return oonf_packet_is_active(&managed->socket_v6);
    default:
      return false;
  }
}